

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

void ym2612_update_chan<2>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int in_ECX;
  short *in_RDX;
  int *in_RSI;
  long in_RDI;
  int t1;
  int t0;
  uint freq_LFO;
  int temp_1;
  int CH_OUTd;
  int temp;
  int CH_S0_OUT_0;
  int *TL_TAB;
  int en3;
  int temp3;
  int en2;
  int temp2;
  int en1;
  int temp1;
  int en0;
  int temp0;
  short *ENV_TAB;
  int env_LFO;
  int YM2612_LFOcnt;
  int YM2612_LFOinc;
  int in3;
  int in2;
  int in1;
  int in0;
  int CH_S0_OUT_1;
  int not_end;
  undefined4 in_stack_ffffffffffffff70;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_1c;
  short *local_18;
  
  local_24 = in_RSI[1];
  local_28 = in_RSI[0x2a];
  local_2c = in_RSI[0x72];
  local_30 = in_RSI[0x4e];
  local_34 = in_RSI[0x96];
  iVar2 = *(int *)(in_RDI + 0x2004);
  local_3c = *(int *)(in_RDI + 0x2000);
  local_1c = in_ECX;
  local_18 = in_RDX;
  if (in_RSI[0x99] != 0x20000000) {
    do {
      local_3c = local_3c + iVar2;
      iVar5 = (int)*(short *)(in_RDI + 0x6878 + (long)(int)(local_3c >> 0x12 & 0x3ff) * 2);
      lVar12 = in_RDI + 0x2868;
      uVar6 = (int)*(short *)(lVar12 + (long)(in_RSI[0x2d] >> 0x10) * 2) + in_RSI[0x1a];
      uVar7 = (int)*(short *)(lVar12 + (long)(in_RSI[0x75] >> 0x10) * 2) + in_RSI[0x62];
      uVar8 = (int)*(short *)(lVar12 + (long)(in_RSI[0x51] >> 0x10) * 2) + in_RSI[0x3e];
      uVar9 = (int)*(short *)(lVar12 + (long)(in_RSI[0x99] >> 0x10) * 2) + in_RSI[0x86];
      lVar12 = in_RDI + 0x7878;
      iVar3 = *in_RSI;
      iVar4 = *(int *)(lVar12 + (long)(int)((int)*(short *)(in_RDI + (long)(int)(local_28 +
                                                                                 (iVar3 + local_24
                                                                                 >> ((byte)in_RSI[7]
                                                                                    & 0x1f)) >> 0xe
                                                                                & 0xfff) * 2) +
                                           ((uVar6 ^ in_RSI[0x1f]) +
                                            (iVar5 >> ((byte)in_RSI[0x38] & 0x1f)) &
                                           (int)(uVar6 - in_RSI[0x20]) >> 0x1f)) * 4);
      iVar5 = *(int *)(lVar12 + (long)(int)((int)*(short *)(in_RDI + (long)(int)(local_34 + iVar3 +
                                                                                 *(int *)(lVar12 + (
                                                  long)(int)((int)*(short *)(in_RDI + (long)(int)(
                                                  local_30 +
                                                  *(int *)(lVar12 + (long)(int)((int)*(short *)(
                                                  in_RDI + (long)(int)(local_2c >> 0xe & 0xfff) * 2)
                                                  + ((uVar7 ^ in_RSI[0x67]) +
                                                     (iVar5 >> ((byte)in_RSI[0x80] & 0x1f)) &
                                                    (int)(uVar7 - in_RSI[0x68]) >> 0x1f)) * 4) >>
                                                  0xe & 0xfff) * 2) +
                                                  ((uVar8 ^ in_RSI[0x43]) +
                                                   (iVar5 >> ((byte)in_RSI[0x5c] & 0x1f)) &
                                                  (int)(uVar8 - in_RSI[0x44]) >> 0x1f)) * 4) >> 0xe
                                                  & 0xfff) * 2) +
                                           ((uVar9 ^ in_RSI[0x8b]) +
                                            (iVar5 >> ((byte)in_RSI[0xa4] & 0x1f)) &
                                           (int)(uVar9 - in_RSI[0x8c]) >> 0x1f)) * 4);
      iVar10 = ((int)*(short *)(in_RDI + 0x7078 + (long)(int)(local_3c >> 0x12 & 0x3ff) * 2) *
                in_RSI[8] >> 10) + 0x100;
      local_28 = ((uint)(in_RSI[0x2b] * iVar10) >> 8) + local_28;
      local_2c = ((uint)(in_RSI[0x73] * iVar10) >> 8) + local_2c;
      local_30 = ((uint)(in_RSI[0x4f] * iVar10) >> 8) + local_30;
      local_34 = ((uint)(in_RSI[0x97] * iVar10) >> 8) + local_34;
      sVar1 = *local_18;
      iVar10 = in_RSI[4];
      iVar11 = (int)local_18[1] + (iVar5 >> 0x10 & in_RSI[5]);
      update_envelope((slot_t *)CONCAT44(iVar11,in_stack_ffffffffffffff70));
      update_envelope((slot_t *)CONCAT44(iVar11,in_stack_ffffffffffffff70));
      update_envelope((slot_t *)CONCAT44(iVar11,in_stack_ffffffffffffff70));
      update_envelope((slot_t *)CONCAT44(iVar11,in_stack_ffffffffffffff70));
      *in_RSI = iVar4;
      *local_18 = sVar1 + ((ushort)((uint)iVar5 >> 0x10) & (ushort)iVar10);
      local_18[1] = (short)iVar11;
      local_18 = local_18 + 2;
      local_1c = local_1c + -1;
      local_24 = iVar3;
    } while (local_1c != 0);
    in_RSI[1] = iVar3;
    in_RSI[0x2a] = local_28;
    in_RSI[0x72] = local_2c;
    in_RSI[0x4e] = local_30;
    in_RSI[0x96] = local_34;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}